

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * __thiscall
trieste::In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3)

{
  initializer_list<trieste::Token> __l;
  allocator_type local_13a;
  less<trieste::Token> local_139;
  undefined1 local_138 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  local_118;
  FastPattern local_e8;
  Token local_80;
  Token *local_78;
  TokenDef *local_70;
  TokenDef *local_68;
  TokenDef *local_60;
  array<trieste::Token,_5UL> types_;
  
  types_._M_elems[0].def = *(TokenDef **)this;
  types_._M_elems[1].def = (TokenDef *)type1;
  types_._M_elems[2].def = types;
  types_._M_elems[3].def = types_1;
  types_._M_elems[4].def = types_2;
  std::make_shared<trieste::detail::Inside<5ul>,std::array<trieste::Token,5ul>&>
            ((array<trieste::Token,_5UL> *)local_138);
  local_138._16_8_ = local_138._0_8_;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_;
  local_138._0_8_ = (TokenDef *)0x0;
  local_138._8_8_ = (TokenDef *)0x0;
  local_80.def = *(TokenDef **)this;
  __l._M_len = 5;
  __l._M_array = &local_80;
  local_78 = type1;
  local_70 = types;
  local_68 = types_1;
  local_60 = types_2;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118,__l,&local_139,&local_13a);
  detail::FastPattern::match_parent
            (&local_e8,
             (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118);
  detail::Pattern::Pattern(__return_storage_ptr__,(PatternPtr *)(local_138 + 0x10),&local_e8);
  detail::FastPattern::~FastPattern(&local_e8);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree(&local_118);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_120);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern In(const Token& type1, const Ts&... types)
  {
    std::array<Token, 1 + sizeof...(types)> types_ = {type1, types...};
    return detail::Pattern(
      std::make_shared<detail::Inside<1 + sizeof...(types)>>(types_),
      detail::FastPattern::match_parent({type1, types...}));
  }